

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

int Extra_TruthVarsAntiSymm(uint *pTruth,int nVars,int iVar0,int iVar1)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  if (9 < nVars) {
    __assert_fail("nVars <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0x2b7,"int Extra_TruthVarsAntiSymm(unsigned int *, int, int, int)");
  }
  uVar3 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar3 = 1;
  }
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    Extra_TruthCofactor0(Extra_TruthVarsAntiSymm::uTemp0,nVars,iVar0);
    Extra_TruthCofactor0(Extra_TruthVarsAntiSymm::uTemp0,nVars,iVar1);
  }
  else {
    lVar2 = uVar4 + 1;
    do {
      Extra_TruthVarsSymm::uTemp1[lVar2 + 0xe] = pTruth[lVar2 + -2];
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
    Extra_TruthCofactor0(Extra_TruthVarsAntiSymm::uTemp0,nVars,iVar0);
    Extra_TruthCofactor0(Extra_TruthVarsAntiSymm::uTemp0,nVars,iVar1);
    if (0 < (int)uVar3) {
      lVar2 = uVar4 + 1;
      do {
        Extra_TruthVarsAntiSymm::uTemp0[lVar2 + 0xe] = pTruth[lVar2 + -2];
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
  }
  Extra_TruthCofactor1(Extra_TruthVarsAntiSymm::uTemp1,nVars,iVar0);
  Extra_TruthCofactor1(Extra_TruthVarsAntiSymm::uTemp1,nVars,iVar1);
  do {
    if ((int)uVar4 < 1) {
      return 1;
    }
    lVar2 = uVar4 + 0xf;
    lVar1 = uVar4 + 0xf;
    uVar4 = uVar4 - 1;
  } while (Extra_TruthVarsSymm::uTemp1[lVar2] == Extra_TruthVarsAntiSymm::uTemp0[lVar1]);
  return 0;
}

Assistant:

int Extra_TruthVarsAntiSymm( unsigned * pTruth, int nVars, int iVar0, int iVar1 )
{
    static unsigned uTemp0[16], uTemp1[16];
    assert( nVars <= 9 );
    // compute Cof00
    Extra_TruthCopy( uTemp0, pTruth, nVars );
    Extra_TruthCofactor0( uTemp0, nVars, iVar0 );
    Extra_TruthCofactor0( uTemp0, nVars, iVar1 );
    // compute Cof11
    Extra_TruthCopy( uTemp1, pTruth, nVars );
    Extra_TruthCofactor1( uTemp1, nVars, iVar0 );
    Extra_TruthCofactor1( uTemp1, nVars, iVar1 );
    // compare
    return Extra_TruthIsEqual( uTemp0, uTemp1, nVars );
}